

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O0

handle * __thiscall
gmlc::libguarded::
shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
::lock(shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
       *this)

{
  lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_RSI;
  pointer in_RDI;
  pointer in_stack_ffffffffffffffa8;
  pointer val;
  unique_lock<std::shared_mutex> local_20 [2];
  
  if ((in_RSI[8].m_handle_lock._M_owns & 1U) == 0) {
    val = in_RDI;
    std::unique_lock<std::shared_mutex>::unique_lock(local_20);
    lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock_handle(in_RSI,val,(unique_lock<std::shared_mutex> *)in_RDI);
    std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)in_RDI);
  }
  else {
    lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock_handle((lock_handle<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
                   *)in_RDI,in_stack_ffffffffffffffa8,(shared_mutex *)0x313d4d);
    val = in_RDI;
  }
  return (handle *)val;
}

Assistant:

auto shared_guarded_opt<T, M>::lock() -> handle
{
    return (enabled) ? handle(&m_obj, m_mutex) :
                       handle(&m_obj, std::unique_lock<M>());
}